

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkUpdateNetwork(Abc_ShaMan_t *p,int fAnd)

{
  Abc_Aig_t *pMan;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iLit;
  Abc_Obj_t *pAVar6;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Abc_Obj_t *pAVar7;
  Vec_Ptr_t *p_02;
  Vec_Int_t *pVVar8;
  void *pvVar9;
  Abc_Ntk_t *pAVar10;
  int iVar11;
  
  pAVar6 = Abc_AigConst1(p->pNtk);
  iVar1 = Abc_ObjToLit(pAVar6);
  p_00 = Vec_PtrAlloc(p->nStartCols);
  p_01 = Vec_PtrAlloc(p->nStartCols);
  for (iVar11 = 0; iVar11 < p->nStartCols; iVar11 = iVar11 + 1) {
    iVar2 = Vec_IntEntry(p->vObj2Lit,iVar11);
    if (fAnd != 0) {
      iVar3 = Abc_LitIsCompl(iVar2);
      if (iVar3 != 0) {
        __assert_fail("!fAnd || !Abc_LitIsCompl(iLit)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                      ,0x263,"Abc_Ntk_t *Abc_NtkUpdateNetwork(Abc_ShaMan_t *, int)");
      }
    }
    pAVar10 = p->pNtk;
    iVar3 = Abc_Lit2Var(iVar2);
    pAVar6 = Abc_NtkObj(pAVar10,iVar3);
    pAVar7 = Abc_AigConst1(p->pNtk);
    if (fAnd == 0) {
      uVar4 = Abc_LitIsCompl(iVar2);
      pAVar7 = (Abc_Obj_t *)((ulong)pAVar7 ^ (ulong)(uVar4 ^ 1));
    }
    Vec_PtrPush(p_00,pAVar6);
    Vec_PtrPush(p_01,pAVar7);
    p->nCountGates = p->nCountGates + -1;
  }
  iVar11 = 0;
  do {
    if (p->vBuckets->nSize <= iVar11) {
      if (p->fVerbose != 0) {
        printf("Total gates collected = %d.  Total gates constructed = %d.\n",
               (ulong)(uint)p->nFoundGates,(ulong)(uint)p->nCountGates);
      }
      iVar11 = p->pNtk->vObjs->nSize;
      pVVar8 = Vec_IntAlloc(iVar11);
      pVVar8->nSize = iVar11;
      if (pVVar8->pArray != (int *)0x0) {
        memset(pVVar8->pArray,0xff,(long)iVar11 << 2);
      }
      iVar11 = p_00->nSize;
      for (iVar2 = 0; iVar2 < iVar11; iVar2 = iVar2 + 1) {
        pvVar9 = Vec_PtrEntry(p_00,iVar2);
        iVar3 = *(int *)((long)pvVar9 + 0x10);
        pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(p_01,iVar2);
        iVar5 = Abc_ObjToLit(pAVar6);
        Vec_IntWriteEntry(pVVar8,iVar3,iVar5);
      }
      Vec_PtrFree(p_00);
      Vec_PtrFree(p_01);
      for (iVar11 = 0; iVar11 < p->pNtk->vObjs->nSize; iVar11 = iVar11 + 1) {
        pAVar6 = Abc_NtkObj(p->pNtk,iVar11);
        if (pAVar6 != (Abc_Obj_t *)0x0) {
          uVar4 = *(uint *)&pAVar6->field_0x14 & 0xf;
          if ((uVar4 < 8) && ((0x98U >> uVar4 & 1) != 0)) {
            iVar2 = Vec_IntEntry(pVVar8,*(pAVar6->vFanins).pArray);
            if (-1 < iVar2) {
              if ((fAnd == 0) || (iVar2 != iVar1)) {
                iVar3 = Abc_LitIsCompl(iVar2);
                uVar4 = *(uint *)&pAVar6->field_0x14 & 0xfffffbff |
                        *(uint *)&pAVar6->field_0x14 & 0x400 ^ iVar3 << 10;
              }
              else {
                uVar4 = *(uint *)&pAVar6->field_0x14 ^ 0x400;
                iVar2 = iVar1;
              }
              *(uint *)&pAVar6->field_0x14 = uVar4;
              iVar2 = Abc_Lit2Var(iVar2);
              Vec_IntWriteEntry(&pAVar6->vFanins,0,iVar2);
            }
          }
          if ((*(uint *)&pAVar6->field_0x14 & 0xf) == 7) {
            iVar2 = Vec_IntEntry(pVVar8,(pAVar6->vFanins).pArray[1]);
            if (-1 < iVar2) {
              if ((fAnd == 0) || (iVar2 != iVar1)) {
                iVar3 = Abc_LitIsCompl(iVar2);
                uVar4 = *(uint *)&pAVar6->field_0x14 & 0xfffff7ff |
                        *(uint *)&pAVar6->field_0x14 & 0x800 ^ iVar3 << 0xb;
              }
              else {
                uVar4 = *(uint *)&pAVar6->field_0x14 ^ 0x800;
                iVar2 = iVar1;
              }
              *(uint *)&pAVar6->field_0x14 = uVar4;
              iVar2 = Abc_Lit2Var(iVar2);
              Vec_IntWriteEntry(&pAVar6->vFanins,1,iVar2);
            }
          }
        }
      }
      Vec_IntFree(pVVar8);
      if (fAnd != 0) {
        pAVar10 = Abc_NtkBalance(p->pNtk,0,0,1);
        return pAVar10;
      }
      pAVar10 = Abc_NtkBalanceExor(p->pNtk,1,0);
      return pAVar10;
    }
    p_02 = (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets,iVar11);
    for (iVar2 = 0; iVar2 < p_02->nSize; iVar2 = iVar2 + 1) {
      pVVar8 = (Vec_Int_t *)Vec_PtrEntry(p_02,iVar2);
      for (iVar3 = 2; iVar3 < pVVar8->nSize; iVar3 = iVar3 + 1) {
        iVar5 = Vec_IntEntry(pVVar8,iVar3);
        if (p->vObj2Lit->nSize <= iVar5) {
          __assert_fail("ObjId < Vec_IntSize(p->vObj2Lit)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                        ,0x278,"Abc_Ntk_t *Abc_NtkUpdateNetwork(Abc_ShaMan_t *, int)");
        }
        if (p->nStartCols <= iVar5) break;
        iLit = Vec_IntEntry(pVVar8,0);
        pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(p_01,iVar5);
        pMan = (Abc_Aig_t *)p->pNtk->pManFunc;
        pAVar7 = Abc_ObjFromLit(p->pNtk,iLit);
        if (fAnd == 0) {
          pAVar6 = Abc_AigXor(pMan,pAVar6,pAVar7);
        }
        else {
          pAVar6 = Abc_AigAnd(pMan,pAVar6,pAVar7);
        }
        Vec_PtrWriteEntry(p_01,iVar5,pAVar6);
        p->nCountGates = p->nCountGates + 1;
      }
    }
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkUpdateNetwork( Abc_ShaMan_t * p, int fAnd )
{
    Abc_Ntk_t * pNtk;
    Vec_Int_t * vInput, * vMap2Repl;
    Vec_Ptr_t * vOrig, * vRepl, * vBucket;
    Abc_Obj_t * pObj, * pNew;
    int i, j, k, ObjId, iLit;
    int iLitConst1 = Abc_ObjToLit( Abc_AigConst1(p->pNtk) );

    vOrig = Vec_PtrAlloc( p->nStartCols );
    vRepl = Vec_PtrAlloc( p->nStartCols );
    for ( i = 0; i < p->nStartCols; i++ )
    {
        iLit = Vec_IntEntry( p->vObj2Lit, i );
        assert( !fAnd || !Abc_LitIsCompl(iLit) );

        pObj = Abc_NtkObj( p->pNtk, Abc_Lit2Var(iLit) );

        if ( fAnd )
            pNew = Abc_AigConst1(p->pNtk);
        else
            pNew = Abc_ObjNotCond( Abc_AigConst1(p->pNtk), !Abc_LitIsCompl(iLit) );

        Vec_PtrPush( vOrig, pObj );
        Vec_PtrPush( vRepl, pNew );

        p->nCountGates--;
    }

    // go through the columns
    Vec_PtrForEachEntry( Vec_Ptr_t *, p->vBuckets, vBucket, i )
    Vec_PtrForEachEntry( Vec_Int_t *, vBucket, vInput, j )
    {
        Vec_IntForEachEntryStart( vInput, ObjId, k, SHARE_NUM )
        {
            assert( ObjId < Vec_IntSize(p->vObj2Lit) );
            if ( ObjId >= p->nStartCols )
                break;
            assert( ObjId < p->nStartCols );
            iLit = Vec_IntEntry( vInput, 0 );

            pNew = (Abc_Obj_t *)Vec_PtrEntry( vRepl, ObjId );
            if ( fAnd )
                pNew = Abc_AigAnd( (Abc_Aig_t *)p->pNtk->pManFunc, pNew, Abc_ObjFromLit(p->pNtk, iLit) );
            else
                pNew = Abc_AigXor( (Abc_Aig_t *)p->pNtk->pManFunc, pNew, Abc_ObjFromLit(p->pNtk, iLit) );
            Vec_PtrWriteEntry( vRepl, ObjId, pNew );
            p->nCountGates++;
        }
    }

    if ( p->fVerbose )
        printf( "Total gates collected = %d.  Total gates constructed = %d.\n", p->nFoundGates, p->nCountGates );

    // create map of originals
    vMap2Repl = Vec_IntStartFull( Abc_NtkObjNumMax(p->pNtk) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrig, pObj, i )
    {
//        printf( "Replacing %d by %d.\n", Abc_ObjId(pObj), Abc_ObjToLit((Abc_Obj_t *)Vec_PtrEntry(vRepl, i)) );
        Vec_IntWriteEntry( vMap2Repl, Abc_ObjId(pObj), Abc_ObjToLit((Abc_Obj_t *)Vec_PtrEntry(vRepl, i)) );
    }
    Vec_PtrFree( vOrig );
    Vec_PtrFree( vRepl );

    // update fanin pointers
    Abc_NtkForEachObj( p->pNtk, pObj, i )
    {
        if ( Abc_ObjIsCo(pObj) || Abc_ObjIsNode(pObj) )
        {
            iLit = Vec_IntEntry( vMap2Repl, Abc_ObjFaninId0(pObj) );
            if ( iLit >= 0 )
            {
                if ( iLit == iLitConst1 && fAnd )
                {
                    pObj->fCompl0 ^= 1;
                    Vec_IntWriteEntry( &pObj->vFanins, 0, Abc_Lit2Var(iLitConst1) );
                }
                else
                {
                    pObj->fCompl0 ^= Abc_LitIsCompl(iLit);
                    Vec_IntWriteEntry( &pObj->vFanins, 0, Abc_Lit2Var(iLit) );
                }
            }
        }
        if ( Abc_ObjIsNode(pObj) )
        {
            iLit = Vec_IntEntry( vMap2Repl, Abc_ObjFaninId1(pObj) );
            if ( iLit >= 0 )
            {
                if ( iLit == iLitConst1 && fAnd )
                {
                    pObj->fCompl1 ^= 1;
                    Vec_IntWriteEntry( &pObj->vFanins, 1, Abc_Lit2Var(iLitConst1) );
                }
                else
                {
                    pObj->fCompl1 ^= Abc_LitIsCompl(iLit);
                    Vec_IntWriteEntry( &pObj->vFanins, 1, Abc_Lit2Var(iLit) );
                }
            }
        }
    }
    Vec_IntFree( vMap2Repl );

//    pNtk = Abc_NtkRestrash( p->pNtk, 1 );
    if ( fAnd )
        pNtk = Abc_NtkBalance( p->pNtk, 0, 0, 1 );
    else
        pNtk = Abc_NtkBalanceExor( p->pNtk, 1, 0 );
    return pNtk;
}